

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecChoice.c
# Opt level: O2

void Cec_ManCombSpecReduce_rec(Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int Id;
  uint uVar1;
  Gia_Obj_t *pObj_00;
  
  if (pObj->Value != 0xffffffff) {
    return;
  }
  Id = Gia_ObjId(p,pObj);
  pObj_00 = Gia_ObjReprObj(p,Id);
  if (pObj_00 == (Gia_Obj_t *)0x0) {
    uVar1 = Cec_ManCombSpecReal(pNew,p,pObj);
  }
  else {
    Cec_ManCombSpecReduce_rec(pNew,p,pObj_00);
    uVar1 = Abc_LitNotCond(pObj_00->Value,
                           ((uint)((ulong)*(undefined8 *)pObj >> 0x20) ^
                           (uint)((ulong)*(undefined8 *)pObj_00 >> 0x20)) >> 0x1f);
  }
  pObj->Value = uVar1;
  return;
}

Assistant:

void Cec_ManCombSpecReduce_rec( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj )
{
    Gia_Obj_t * pRepr;
    if ( ~pObj->Value )
        return;
    if ( (pRepr = Gia_ObjReprObj(p, Gia_ObjId(p, pObj))) )
    {
        Cec_ManCombSpecReduce_rec( pNew, p, pRepr );
        pObj->Value = Abc_LitNotCond( pRepr->Value, Gia_ObjPhase(pRepr) ^ Gia_ObjPhase(pObj) );
        return;
    }
    pObj->Value = Cec_ManCombSpecReal( pNew, p, pObj );
}